

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O1

size_t __thiscall
spvtools::opt::analysis::Struct::ComputeExtraStateHash(Struct *this,size_t hash,SeenTypes *seen)

{
  pointer ppTVar1;
  _Rb_tree_node_base *p_Var2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *val;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  pointer ppTVar5;
  
  ppTVar1 = (this->element_types_).
            super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppTVar5 = (this->element_types_).
                 super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppTVar5 != ppTVar1;
      ppTVar5 = ppTVar5 + 1) {
    hash = Type::ComputeHashValue(*ppTVar5,hash,seen);
  }
  for (p_Var2 = (this->element_decorations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->element_decorations_)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    hash = hash * 0x40 + 0x9e3779b9 + (hash >> 2) + (ulong)p_Var2[1]._M_color ^ hash;
    for (p_Var3 = p_Var2[1]._M_parent; p_Var3 != p_Var2[1]._M_left;
        p_Var3 = (_Base_ptr)&p_Var3->_M_right) {
      for (p_Var4 = *(_Base_ptr *)p_Var3; p_Var4 != p_Var3->_M_parent;
          p_Var4 = (_Base_ptr)&p_Var4->field_0x4) {
        hash = hash ^ hash * 0x40 + 0x9e3779b9 + (hash >> 2) + (ulong)p_Var4->_M_color;
      }
    }
  }
  return hash;
}

Assistant:

size_t Struct::ComputeExtraStateHash(size_t hash, SeenTypes* seen) const {
  for (auto* t : element_types_) {
    hash = t->ComputeHashValue(hash, seen);
  }
  for (const auto& pair : element_decorations_) {
    hash = hash_combine(hash, pair.first, pair.second);
  }
  return hash;
}